

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O1

planck_unit_suite_t * cpp_wrapper3_getsuite_3(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_all_records_all,"test_cpp_wrapper_all_records_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_all_records_nonexist_empty_all,
             "test_cpp_wrapper_all_records_nonexist_empty_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_all_records_populated_all,
             "test_cpp_wrapper_all_records_populated_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_all_records_random_all,"test_cpp_wrapper_all_records_random_all"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_open_close_all,"test_cpp_wrapper_open_close_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper3_getsuite_3(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_all_records_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_all_records_nonexist_empty_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_all_records_populated_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_all_records_random_all);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_open_close_all);

	return suite;
}